

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManDumpDsd(If_DsdMan_t *p,int Support)

{
  uint uVar1;
  int iVar2;
  int nVars;
  int iVar3;
  FILE *__stream;
  Vec_Int_t *p_00;
  If_DsdObj_t *pObj;
  word *pTruth;
  int i;
  long lVar4;
  
  __stream = fopen("tts_nondsd.txt","wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n","tts_nondsd.txt");
    return;
  }
  iVar2 = 6;
  if (6 < (uint)Support) {
    iVar2 = Support;
  }
  lVar4 = 3;
  do {
    if (p->nVars < lVar4) {
      fclose(__stream);
      return;
    }
    p_00 = Vec_IntStart(p->vTtMem[lVar4]->nEntries);
    nVars = iVar2;
    if (Support == 0) {
      nVars = (int)lVar4;
    }
    for (i = 0; i < (p->vObjs).nSize; i = i + 1) {
      pObj = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,i);
      uVar1 = *(uint *)&pObj->field_0x4;
      if (Support == 0) {
        if ((uVar1 & 7) == 6) goto LAB_00360ba4;
      }
      else if ((uVar1 & 7) == 6 && (uVar1 >> 3 & 0x1f) == Support) {
LAB_00360ba4:
        iVar3 = If_DsdObjTruthId(p,pObj);
        iVar3 = Vec_IntEntry(p_00,iVar3);
        if (iVar3 == 0) {
          iVar3 = If_DsdObjTruthId(p,pObj);
          Vec_IntWriteEntry(p_00,iVar3,1);
          fwrite("0x",2,1,__stream);
          pTruth = If_DsdObjTruth(p,pObj);
          Abc_TtPrintHexRev((FILE *)__stream,pTruth,nVars);
          fputc(10,__stream);
        }
      }
    }
    Vec_IntFree(p_00);
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void If_DsdManDumpDsd( If_DsdMan_t * p, int Support )
{
    char * pFileName = "tts_nondsd.txt";
    If_DsdObj_t * pObj; 
    Vec_Int_t * vMap;
    FILE * pFile = fopen( pFileName, "wb" );
    int v, i;
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return;
    }
    for ( v = 3; v <= p->nVars; v++ )
    {
        vMap = Vec_IntStart( Vec_MemEntryNum(p->vTtMem[v]) );
        If_DsdVecForEachObj( &p->vObjs, pObj, i )
        {
            if ( Support && Support != If_DsdObjSuppSize(pObj) )
                continue;
            if ( If_DsdObjType(pObj) != IF_DSD_PRIME )
                continue;
            if ( Vec_IntEntry(vMap, If_DsdObjTruthId(p, pObj)) )
                continue;
            Vec_IntWriteEntry(vMap, If_DsdObjTruthId(p, pObj), 1);
            fprintf( pFile, "0x" );
            Abc_TtPrintHexRev( pFile, If_DsdObjTruth(p, pObj), Support ? Abc_MaxInt(Support, 6) : v );
            fprintf( pFile, "\n" );
            //printf( "    " );
            //Dau_DsdPrintFromTruth( If_DsdObjTruth(p, pObj), p->nVars );
        }
        Vec_IntFree( vMap );
    }
    fclose( pFile );
}